

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracepoint_map.cpp
# Opt level: O1

MapInfo * __thiscall
HawkTracer::client::TracepointMap::get_label_info
          (MapInfo *__return_storage_ptr__,TracepointMap *this,uint64_t label)

{
  ulong uVar1;
  bool bVar2;
  char cVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  uint64_t uVar6;
  ulong uVar7;
  string *__str;
  char cVar8;
  __node_base_ptr p_Var9;
  __node_base_ptr p_Var10;
  _Hash_node_base *p_Var11;
  __hash_code __code;
  uint64_t local_28;
  
  uVar1 = (this->_input_map)._M_h._M_bucket_count;
  uVar7 = label % uVar1;
  p_Var9 = (this->_input_map)._M_h._M_buckets[uVar7];
  p_Var10 = (__node_base_ptr)0x0;
  if ((p_Var9 != (__node_base_ptr)0x0) &&
     (p_Var11 = p_Var9->_M_nxt, p_Var10 = p_Var9,
     p_Var9->_M_nxt[1]._M_nxt != (_Hash_node_base *)label)) {
    while (p_Var9 = p_Var11, p_Var11 = p_Var9->_M_nxt, p_Var11 != (_Hash_node_base *)0x0) {
      p_Var10 = (__node_base_ptr)0x0;
      if (((ulong)p_Var11[1]._M_nxt % uVar1 != uVar7) ||
         (p_Var10 = p_Var9, p_Var11[1]._M_nxt == (_Hash_node_base *)label)) goto LAB_00110f64;
    }
    p_Var10 = (__node_base_ptr)0x0;
  }
LAB_00110f64:
  if (p_Var10 == (__node_base_ptr)0x0) {
    p_Var11 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var11 = p_Var10->_M_nxt;
  }
  local_28 = label;
  if (p_Var11 == (_Hash_node_base *)0x0) {
    cVar8 = '\x01';
    if (9 < label) {
      uVar6 = label;
      cVar3 = '\x04';
      do {
        cVar8 = cVar3;
        if (uVar6 < 100) {
          cVar8 = cVar8 + -2;
          goto LAB_0011100f;
        }
        if (uVar6 < 1000) {
          cVar8 = cVar8 + -1;
          goto LAB_0011100f;
        }
        if (uVar6 < 10000) goto LAB_0011100f;
        bVar2 = 99999 < uVar6;
        uVar6 = uVar6 / 10000;
        cVar3 = cVar8 + '\x04';
      } while (bVar2);
      cVar8 = cVar8 + '\x01';
    }
LAB_0011100f:
    (__return_storage_ptr__->label)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->label).field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar8);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((__return_storage_ptr__->label)._M_dataplus._M_p,
               (uint)(__return_storage_ptr__->label)._M_string_length,label);
    (__return_storage_ptr__->category)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->category).field_2;
    *(undefined4 *)&(__return_storage_ptr__->category).field_2 = 0x61666564;
    *(undefined4 *)((long)&(__return_storage_ptr__->category).field_2 + 3) = 0x746c7561;
    (__return_storage_ptr__->category)._M_string_length = 7;
    (__return_storage_ptr__->category).field_2._M_local_buf[7] = '\0';
    pmVar4 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_std::allocator<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_std::allocator<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this,&local_28);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    std::__cxx11::string::_M_assign((string *)&pmVar4->category);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot find mapping for label ",0x1e);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  else {
    (__return_storage_ptr__->label)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->label).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,p_Var11[2]._M_nxt,
               (long)&(p_Var11[2]._M_nxt)->_M_nxt + (long)&(p_Var11[3]._M_nxt)->_M_nxt);
    (__return_storage_ptr__->category)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->category).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->category,p_Var11[6]._M_nxt,
               (long)&(p_Var11[6]._M_nxt)->_M_nxt + (long)&(p_Var11[7]._M_nxt)->_M_nxt);
  }
  return __return_storage_ptr__;
}

Assistant:

TracepointMap::MapInfo TracepointMap::get_label_info(uint64_t label)
{
    auto it = _input_map.find(label);

    if (it != _input_map.end())
    {
        return it->second;
    }

    MapInfo info = { std::to_string(label), category_to_string(Unknown) };
    _input_map[label] = info;

    std::cerr << "Cannot find mapping for label " << label << std::endl;
    return info;
}